

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

int __thiscall lzham::lzcompressor::init(lzcompressor *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  uint i;
  uint accel_flags;
  uint match_accel_helper_threads;
  int num_parse_jobs;
  uint max_block_size;
  uint dict_size;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint local_44;
  uint local_40;
  bool local_3a;
  bool local_39;
  uint local_30;
  uint local_2c;
  undefined1 local_1;
  
  clear((lzcompressor *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if ((*(uint *)(ctx + 0x10) < 0xf) || (0x1d < *(uint *)(ctx + 0x10))) {
    local_1 = 0;
    this = (lzcompressor *)ctx;
  }
  else if ((*(int *)(ctx + 0xc) < 0) || (5 < *(int *)(ctx + 0xc))) {
    local_1 = 0;
    this = (lzcompressor *)ctx;
  }
  else {
    memcpy(&this->m_params,ctx,0x3c);
    local_39 = false;
    if ((this->m_params).m_pTask_pool != (task_pool *)0x0) {
      uVar3 = task_pool::get_num_threads((this->m_params).m_pTask_pool);
      local_39 = false;
      if (uVar3 != 0) {
        local_39 = (this->m_params).m_max_helper_threads != 0;
      }
    }
    this->m_use_task_pool = local_39;
    local_3a = false;
    if (((this->m_params).m_lzham_compress_flags & 2) != 0) {
      local_3a = (this->m_params).m_compression_level == cCompressionLevelUber;
    }
    this->m_use_extreme_parsing = local_3a;
    if ((this->m_use_task_pool & 1U) == 0) {
      (this->m_params).m_max_helper_threads = 0;
    }
    uVar4 = *(uint *)(ctx + 0xc);
    uVar1 = *(undefined8 *)(s_level_settings + (ulong)uVar4 * 0xc);
    (this->m_settings).m_fast_bytes = (int)uVar1;
    (this->m_settings).m_match_accel_max_matches_per_probe = (int)((ulong)uVar1 >> 0x20);
    (this->m_settings).m_match_accel_max_probes =
         *(uint *)(s_level_settings + (ulong)uVar4 * 0xc + 8);
    if ((this->m_use_extreme_parsing & 1U) == 0) {
      local_40 = (this->m_settings).m_fast_bytes;
    }
    else {
      local_40 = 0x60;
    }
    this->m_fast_bytes = local_40;
    if ((this->m_params).m_fast_bytes_override != 0) {
      uVar4 = math::clamp<unsigned_int>((this->m_params).m_fast_bytes_override,8,0x102);
      this->m_fast_bytes = uVar4;
    }
    uVar4 = 1 << ((byte)(this->m_params).m_dict_size_log2 & 0x1f);
    if (*(int *)(ctx + 0x28) != 0) {
      if (*(long *)(ctx + 0x20) == 0) {
        local_1 = 0;
        this = (lzcompressor *)ctx;
        goto LAB_0010f654;
      }
      if (uVar4 < *(uint *)(ctx + 0x28)) {
        local_1 = 0;
        this = (lzcompressor *)(ulong)*(uint *)(ctx + 0x28);
        goto LAB_0010f654;
      }
    }
    uVar4 = uVar4 >> 3;
    if (uVar4 < (this->m_params).m_block_size) {
      (this->m_params).m_block_size = uVar4;
    }
    this->m_num_parse_threads = 1;
    if (((this->m_params).m_max_helper_threads != 0) &&
       (((this->m_params).m_lzham_compress_flags & 0x40) == 0)) {
      if ((this->m_params).m_block_size < 0x4000) {
        if ((this->m_params).m_max_helper_threads + 1 < 9) {
          local_44 = (this->m_params).m_max_helper_threads + 1;
        }
        else {
          local_44 = 8;
        }
        this->m_num_parse_threads = local_44;
      }
      else if (((this->m_params).m_max_helper_threads < 6) ||
              ((this->m_params).m_compression_level == cCompressionLevelFastest)) {
        this->m_num_parse_threads = 1;
      }
      else {
        uVar3 = 2;
        if ((this->m_use_extreme_parsing & 1U) != 0) {
          uVar3 = 4;
        }
        this->m_num_parse_threads = uVar3;
      }
    }
    local_2c = (uint)(((this->m_params).m_lzham_compress_flags & 4) != 0);
    if (0 < (int)(this->m_params).m_compression_level) {
      if (((this->m_params).m_lzham_compress_flags & 0x80) == 0) {
        local_2c = local_2c | 4;
      }
      local_2c = local_2c | 2;
    }
    uVar3 = (this->m_settings).m_match_accel_max_probes;
    uVar4 = search_accelerator::init(&this->m_accel,(EVP_PKEY_CTX *)this);
    if ((uVar4 & 1) == 0) {
      local_1 = 0;
      this = (lzcompressor *)(ulong)uVar4;
    }
    else {
      lzham::CLZDecompBase::init_position_slots((uint)this);
      CLZBase::init_slot_tabs(&this->super_CLZBase);
      uVar4 = state::init(&this->m_state,(EVP_PKEY_CTX *)this);
      if ((uVar4 & 1) == 0) {
        local_1 = 0;
        this = (lzcompressor *)(ulong)uVar4;
      }
      else {
        bVar2 = vector<unsigned_char>::try_reserve
                          ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),
                           in_stack_ffffffffffffff9c);
        if (bVar2) {
          bVar2 = vector<unsigned_char>::try_reserve
                            ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),
                             in_stack_ffffffffffffff9c);
          if (bVar2) {
            for (local_30 = 0; local_30 < 9; local_30 = local_30 + 1) {
              uVar4 = raw_parse_thread_state::init
                                (&this->m_parse_thread_state[local_30].super_raw_parse_thread_state,
                                 (EVP_PKEY_CTX *)this);
              if ((uVar4 & 1) == 0) {
                local_1 = 0;
                this = (lzcompressor *)(ulong)uVar4;
                goto LAB_0010f654;
              }
            }
            if (*(int *)(ctx + 0x28) != 0) {
              bVar2 = init_seed_bytes((lzcompressor *)CONCAT44(in_stack_ffffffffffffffac,local_2c));
              if (!bVar2) {
                local_1 = 0;
                this = (lzcompressor *)CONCAT71(extraout_var_01,bVar2);
                goto LAB_0010f654;
              }
            }
            bVar2 = send_zlib_header(this);
            if (bVar2) {
              this->m_src_size = 0;
              local_1 = 1;
            }
            else {
              local_1 = 0;
              this = (lzcompressor *)CONCAT71(extraout_var_02,bVar2);
            }
          }
          else {
            local_1 = 0;
            this = (lzcompressor *)CONCAT71(extraout_var_00,bVar2);
          }
        }
        else {
          local_1 = 0;
          this = (lzcompressor *)CONCAT71(extraout_var,bVar2);
        }
      }
    }
  }
LAB_0010f654:
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool lzcompressor::init(const init_params& params)
   {
      clear();

      if ((params.m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (params.m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
      {
         LZHAM_LOG_ERROR(7001);
         return false;
      }

      if ((params.m_compression_level < 0) || (params.m_compression_level > cCompressionLevelCount))
      {
         LZHAM_LOG_ERROR(7002);
         return false;
      }

      m_params = params;
      m_use_task_pool = (m_params.m_pTask_pool) && (m_params.m_pTask_pool->get_num_threads() != 0) && (m_params.m_max_helper_threads > 0);

      m_use_extreme_parsing = ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) && (m_params.m_compression_level == cCompressionLevelUber));

      if (!m_use_task_pool)
         m_params.m_max_helper_threads = 0;

      m_settings = s_level_settings[params.m_compression_level];

      m_fast_bytes = m_use_extreme_parsing ? LZHAM_EXTREME_PARSING_FAST_BYTES : m_settings.m_fast_bytes;
      if (m_params.m_fast_bytes_override)
      {
         m_fast_bytes = math::clamp<uint>(m_params.m_fast_bytes_override, 8, CLZBase::cMaxMatchLen + 1);
      }

      const uint dict_size = 1U << m_params.m_dict_size_log2;

      if (params.m_num_seed_bytes)
      {
         if (!params.m_pSeed_bytes)
         {
            LZHAM_LOG_ERROR(7003);
            return false;
         }
         if (params.m_num_seed_bytes > dict_size)
         {
            LZHAM_LOG_ERROR(7004);
            return false;
         }
      }

      uint max_block_size = dict_size / 8;
      if (m_params.m_block_size > max_block_size)
      {
         m_params.m_block_size = max_block_size;
      }

      m_num_parse_threads = 1;

#if !LZHAM_FORCE_SINGLE_THREADED_PARSING
      if ((m_params.m_max_helper_threads > 0) && ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING) == 0))
      {
         LZHAM_ASSUME(cMaxParseThreads >= 4);

         if (m_params.m_block_size < 16384)
            m_num_parse_threads = LZHAM_MIN(cMaxParseThreads, m_params.m_max_helper_threads + 1);
         else if ((m_params.m_max_helper_threads <= 5) || (m_params.m_compression_level == cCompressionLevelFastest))
            m_num_parse_threads = 1;
         else
            m_num_parse_threads = m_use_extreme_parsing ? 4 : 2;
      }
#endif

      int num_parse_jobs = m_num_parse_threads - 1;
      uint match_accel_helper_threads = LZHAM_MAX(0, (int)m_params.m_max_helper_threads - num_parse_jobs);
      match_accel_helper_threads = LZHAM_MIN(match_accel_helper_threads, cMatchAccelMaxSupportedThreads);

      LZHAM_ASSERT(m_num_parse_threads >= 1);
      LZHAM_ASSERT(m_num_parse_threads <= cMaxParseThreads);

      if (!m_use_task_pool)
      {
         LZHAM_ASSERT(!match_accel_helper_threads && (m_num_parse_threads == 1));
      }
      else
      {
         LZHAM_ASSERT((match_accel_helper_threads + (m_num_parse_threads - 1)) <= m_params.m_max_helper_threads);
      }

      uint accel_flags = 0;
      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_DETERMINISTIC_PARSING)
         accel_flags |= search_accelerator::cFlagDeterministic;

      if (m_params.m_compression_level > cCompressionLevelFastest)
      {
         if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_USE_LOW_MEMORY_MATCH_FINDER) == 0)
            accel_flags |= search_accelerator::cFlagHash24;

         accel_flags |= search_accelerator::cFlagLen2Matches;
      }

      if (!m_accel.init(this, params.m_pTask_pool, match_accel_helper_threads, dict_size, m_settings.m_match_accel_max_matches_per_probe, false, m_settings.m_match_accel_max_probes, accel_flags))
      {
         LZHAM_LOG_ERROR(7005);
         return false;
      }

      init_position_slots(params.m_dict_size_log2);
      init_slot_tabs();

      if (!m_state.init(*this, m_params.m_table_max_update_interval, m_params.m_table_update_interval_slow_rate))
      {
         LZHAM_LOG_ERROR(7006);
         return false;
      }

      if (!m_block_buf.try_reserve(m_params.m_block_size))
      {
         LZHAM_LOG_ERROR(7007);
         return false;
      }

      if (!m_comp_buf.try_reserve(m_params.m_block_size*2))
      {
         LZHAM_LOG_ERROR(7008);
         return false;
      }

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_parse_thread_state); i++)
      {
         if (!m_parse_thread_state[i].init(*this, m_params))
         {
            LZHAM_LOG_ERROR(7009);
            return false;
         }
      }

      if (params.m_num_seed_bytes)
      {
         if (!init_seed_bytes())
         {
            LZHAM_LOG_ERROR(7010);
            return false;
         }
      }

      if (!send_zlib_header())
      {
         LZHAM_LOG_ERROR(7011);
         return false;
      }

      m_src_size = 0;

      return true;
   }